

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

VariablePtr __thiscall libcellml::Variable::equivalentVariable(Variable *this,size_t index)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  weak_ptr<libcellml::Variable> *variableWeak;
  long lVar6;
  VariablePtr VVar7;
  
  lVar6 = *(long *)(*(long *)(index + 8) + 0x58);
  lVar1 = *(long *)(*(long *)(index + 8) + 0x60);
  _Var4._M_pi = in_RDX;
  if (lVar6 != lVar1) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)this,lVar6);
      if ((this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity ==
          (_func_int **)0x0) {
LAB_00293064:
        bVar3 = true;
        bVar2 = false;
      }
      else {
        if (p_Var5 != in_RDX) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var5->_vptr__Sp_counted_base + 1);
          goto LAB_00293064;
        }
        bVar2 = true;
        bVar3 = false;
      }
      _Var4._M_pi = extraout_RDX;
      if ((!bVar2) &&
         (this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
         this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var4._M_pi = extraout_RDX_00;
      }
      if (!bVar3) goto LAB_0029308f;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != lVar1);
  }
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = (_func_int **)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
LAB_0029308f:
  VVar7.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  VVar7.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (VariablePtr)VVar7.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr Variable::equivalentVariable(size_t index) const
{
    size_t count = 0;
    for (const auto &variableWeak : pFunc()->mEquivalentVariables) {
        auto variable = variableWeak.lock();
        if (variable != nullptr) {
            if (count == index) {
                return variable;
            }
            ++count;
        }
    }

    return nullptr;
}